

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_lsd_adaptive<8u>(Cacheblock<8U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  ulong uVar2;
  void *__src;
  long lVar3;
  Cacheblock<8U> *pCVar4;
  size_t sVar5;
  ushort uVar6;
  uchar *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  Cacheblock<8U> *pCStack_80050;
  long alStack_80038 [65537];
  
  pCStack_80050 = cache;
LAB_0019e58f:
  if (N < 0x10000) {
    msd_lsd<8u>(pCStack_80050,N,depth);
    return;
  }
  fill_cache<8u>(pCStack_80050,N,depth);
  uVar10 = 6;
  for (iVar9 = 7; 0 < iVar9; iVar9 = iVar9 + -2) {
    puVar7 = (pCStack_80050->chars)._M_elems + uVar10 + 1;
    memset(alStack_80038,0,0x80000);
    uVar2 = N;
    while (bVar12 = uVar2 != 0, uVar2 = uVar2 - 1, bVar12) {
      alStack_80038[(ushort)(*(ushort *)(puVar7 + -1) << 8 | *(ushort *)(puVar7 + -1) >> 8)] =
           alStack_80038[(ushort)(*(ushort *)(puVar7 + -1) << 8 | *(ushort *)(puVar7 + -1) >> 8)] +
           1;
      puVar7 = puVar7 + 0x10;
    }
    __src = malloc(N << 4);
    msd_lsd_adaptive<8U>::bucketindex[0] = 0;
    sVar5 = 0;
    for (lVar3 = 0; pCVar4 = pCStack_80050, uVar2 = N, lVar3 != 0xffff; lVar3 = lVar3 + 1) {
      sVar5 = sVar5 + alStack_80038[lVar3];
      msd_lsd_adaptive<8U>::bucketindex[lVar3 + 1] = sVar5;
    }
    while (uVar2 != 0) {
      uVar6 = *(ushort *)((pCVar4->chars)._M_elems + uVar10);
      uVar6 = uVar6 << 8 | uVar6 >> 8;
      sVar5 = msd_lsd_adaptive<8U>::bucketindex[uVar6];
      msd_lsd_adaptive<8U>::bucketindex[uVar6] = sVar5 + 1;
      puVar7 = pCVar4->ptr;
      puVar1 = (undefined8 *)((long)__src + sVar5 * 0x10);
      *puVar1 = *(undefined8 *)(pCVar4->chars)._M_elems;
      puVar1[1] = puVar7;
      pCVar4 = pCVar4 + 1;
      uVar2 = uVar2 - 1;
    }
    memcpy(pCStack_80050,__src,N << 4);
    free(__src);
    uVar10 = (ulong)((int)uVar10 - 2);
  }
  depth = depth + 8;
  lVar3 = 0;
  do {
    lVar11 = lVar3;
    pCVar4 = pCStack_80050 + lVar11;
    lVar8 = -1;
    while( true ) {
      if (lVar11 - N == lVar8) {
        N = -lVar8;
        if ((N == 0 || lVar8 == -1) ||
           (pCVar4 = pCStack_80050 + lVar11, pCStack_80050 = pCStack_80050 + lVar11,
           (pCVar4->chars)._M_elems[7] == '\0')) {
          return;
        }
        goto LAB_0019e58f;
      }
      if (*(long *)(pCVar4->chars)._M_elems != *(long *)pCVar4[1].chars._M_elems) break;
      lVar8 = lVar8 + -1;
      pCVar4 = pCVar4 + 1;
    }
    lVar3 = lVar11 - lVar8;
    if ((1 < (ulong)-lVar8) && (pCStack_80050[lVar11].chars._M_elems[7] != '\0')) {
      msd_lsd_adaptive<8u>(pCStack_80050 + lVar11,-lVar8,depth);
    }
  } while( true );
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}